

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O0

void * __thiscall cppnet::PoolAlloter::ReFill(PoolAlloter *this,uint32_t size,uint32_t num)

{
  uint32_t uVar1;
  void *pvVar2;
  reference ppMVar3;
  int local_54;
  value_type pMStack_50;
  uint32_t i;
  MemNode *next;
  MemNode *current;
  MemNode *res;
  MemNode **my_free;
  char *chunk;
  uint32_t local_20;
  uint32_t nums;
  uint32_t num_local;
  uint32_t size_local;
  PoolAlloter *this_local;
  
  chunk._4_4_ = num;
  local_20 = num;
  nums = size;
  _num_local = this;
  pvVar2 = ChunkAlloc(this,size,(uint32_t *)((long)&chunk + 4));
  if (chunk._4_4_ != 1) {
    uVar1 = FreeListIndex(this,nums,8);
    ppMVar3 = std::
              vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
              ::operator[](&this->_free_list,(ulong)uVar1);
    *ppMVar3 = (value_type)((long)pvVar2 + (ulong)nums);
    pMStack_50 = (value_type)((long)pvVar2 + (ulong)nums);
    for (local_54 = 1; chunk._4_4_ - 1 != local_54; local_54 = local_54 + 1) {
      pMStack_50->_next = (MemNode *)(pMStack_50->_data + nums);
      pMStack_50 = (MemNode *)(pMStack_50->_data + nums);
    }
    pMStack_50->_next = (MemNode *)0x0;
  }
  return pvVar2;
}

Assistant:

void* PoolAlloter::ReFill(uint32_t size, uint32_t num) {
    uint32_t nums = num;

    char* chunk = (char*)ChunkAlloc(size, nums);

    MemNode* volatile* my_free;
    MemNode* res, *current, *next;
    if (1 == nums) {
        return chunk;
    }

    res = (MemNode*)chunk;
    
    my_free = &(_free_list[FreeListIndex(size)]);

    *my_free = next = (MemNode*)(chunk + size);
    for (uint32_t i = 1;; i++) {
        current = next;
        next = (MemNode*)((char*)next + size);
        if (nums - 1 == i) {
            current->_next = nullptr;
            break;

        } else {
            current->_next = next;
        }
    }
    return res;
}